

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ActiveAtomicCounterBuffersCase::iterate
          (ActiveAtomicCounterBuffersCase *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  TestLog *pTVar4;
  Context *pCVar5;
  RenderContext *pRVar6;
  int iVar7;
  undefined4 extraout_var;
  TestError *pTVar8;
  string *psVar9;
  long lVar10;
  ScopedLogSection section_1;
  ScopedLogSection section;
  CallLogWrapper gl;
  Program program;
  ResultCollector result;
  ScopedLogSection local_288;
  string local_280;
  ScopedLogSection local_260;
  value_type local_258;
  CallLogWrapper local_238;
  undefined1 local_220 [152];
  GLuint local_188;
  bool local_160;
  undefined1 local_150 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_c0;
  undefined1 local_a0 [32];
  ResultCollector local_80;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_238,(Functions *)CONCAT44(extraout_var,iVar7),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pcVar1 = local_220 + 0x10;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar4,(string *)local_220);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_238.m_enableLog = true;
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Initial","");
  pcVar3 = local_150 + 0x10;
  local_150._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar4,(string *)local_220,(string *)local_150)
  ;
  if ((pointer)local_150._0_8_ != pcVar3) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  glu::Program::Program((Program *)local_220,((this->super_TestCase).m_context)->m_renderCtx);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&local_80,&local_238,local_220._8_4_,0x92d9,0,this->m_verifier);
  glu::Program::~Program((Program *)local_220);
  tcu::TestLog::endSection((TestLog *)CONCAT44(local_260.m_log._4_4_,(uint)local_260.m_log));
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"NoBuffers","");
  local_150._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"No buffers","");
  psVar9 = (string *)local_150;
  tcu::ScopedLogSection::ScopedLogSection(&local_288,pTVar4,(string *)local_220,psVar9);
  if ((pointer)local_150._0_8_ != pcVar3) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  pCVar5 = (this->super_TestCase).m_context;
  pRVar6 = pCVar5->m_renderCtx;
  local_a0[0x10] = 0;
  local_a0._17_8_ = 0;
  local_a0._0_8_ = (pointer)0x0;
  local_a0[8] = 0;
  local_a0._9_7_ = 0;
  memset(local_150,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)pCVar5,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)psVar9);
  local_260.m_log._0_4_ = 5;
  paVar2 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_280._M_dataplus._M_p,
             local_280._M_dataplus._M_p + local_280._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_150 + (ulong)(uint)local_260.m_log * 0x18),&local_258);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_220,pRVar6,(ProgramSources *)local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_c0);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_150 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_220);
  if (local_160 != false) {
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&local_80,&local_238,local_188,0x92d9,0,this->m_verifier);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_220);
    tcu::TestLog::endSection(local_288.m_log);
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_220._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"OneBuffer","");
    local_150._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"One buffer","");
    psVar9 = (string *)local_150;
    tcu::ScopedLogSection::ScopedLogSection(&local_288,pTVar4,(string *)local_220,psVar9);
    if ((pointer)local_150._0_8_ != pcVar3) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if ((pointer)local_220._0_8_ != pcVar1) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    pCVar5 = (this->super_TestCase).m_context;
    pRVar6 = pCVar5->m_renderCtx;
    local_a0[0x10] = 0;
    local_a0._17_8_ = 0;
    local_a0._0_8_ = (pointer)0x0;
    local_a0[8] = 0;
    local_a0._9_7_ = 0;
    memset(local_150,0,0xac);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_280,(_anonymous_namespace_ *)pCVar5,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) uniform highp atomic_uint u_counters[2];\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = float(atomicCounterIncrement(u_counters[0])) + float(atomicCounterIncrement(u_counters[1]));\n}\n"
               ,(char *)psVar9);
    local_260.m_log._0_4_ = 5;
    local_258._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_280._M_dataplus._M_p,
               local_280._M_dataplus._M_p + local_280._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + (ulong)(uint)local_260.m_log * 0x18),&local_258);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_220,pRVar6,(ProgramSources *)local_150)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_c0);
    lVar10 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + lVar10));
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != -0x18);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (ShaderProgram *)local_220);
    if (local_160 != false) {
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                (&local_80,&local_238,local_188,0x92d9,1,this->m_verifier);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_220);
      tcu::TestLog::endSection(local_288.m_log);
      tcu::ResultCollector::setTestContextResult
                (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
        operator_delete(local_80.m_prefix._M_dataplus._M_p,
                        local_80.m_prefix.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::~CallLogWrapper(&local_238);
      return STOP;
    }
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"failed to build program","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x260);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"failed to build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x255);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ActiveAtomicCounterBuffersCase::IterateResult ActiveAtomicCounterBuffersCase::iterate (void)
{
	static const char* const	s_computeTemplate0	=	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) uniform highp atomic_uint u_counters[2];\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = float(atomicCounterIncrement(u_counters[0])) + float(atomicCounterIncrement(u_counters[1]));\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Initial", "Initial");
		glu::Program				program		(m_context.getRenderContext());

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "NoBuffers", "No buffers");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate0)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "OneBuffer", "One buffer");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate1)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 1, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}